

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

PLYValue * __thiscall gvr::PLYWriter::nextValue(PLYWriter *this)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference ppPVar4;
  long lVar5;
  undefined8 uVar6;
  PLYProperty *this_00;
  PLYValue *pPVar7;
  string *in_RDI;
  bool bVar8;
  int in_stack_ffffffffffffff7c;
  PLYElement *this_01;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffffc4;
  allocator local_29;
  string local_28 [40];
  
  *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) + -1;
  if (*(int *)(in_RDI + 0x44) < 0) {
    *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + -1;
    if (*(int *)(in_RDI + 0x40) < 1) {
      *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + -1;
      if (*(long *)(in_RDI + 0x38) < 1) {
        *(undefined8 *)(in_RDI + 0x28) = 0;
        *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
        while( true ) {
          uVar1 = *(ulong *)(in_RDI + 0x30);
          sVar3 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size
                            ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                             (in_RDI + 8));
          bVar8 = false;
          if (uVar1 < sVar3) {
            ppPVar4 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                                ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                                 (in_RDI + 8),*(size_type *)(in_RDI + 0x30));
            lVar5 = PLYElement::getInstances(*ppPVar4);
            bVar8 = true;
            if (0 < lVar5) {
              std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                        ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                         (in_RDI + 8),*(size_type *)(in_RDI + 0x30));
              iVar2 = PLYElement::getPropertyCount((PLYElement *)0x124cdf);
              bVar8 = iVar2 == 0;
            }
          }
          if (!bVar8) break;
          *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
        }
        uVar1 = *(ulong *)(in_RDI + 0x30);
        sVar3 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size
                          ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                           (in_RDI + 8));
        if (sVar3 <= uVar1) {
          std::ostream::flush();
          uVar9 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
          uVar6 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_28,"Attempt to write more data than specified in the PLY header",
                     &local_29);
          gutil::IOException::IOException
                    ((IOException *)CONCAT44(in_stack_ffffffffffffffc4,uVar9),in_RDI);
          __cxa_throw(uVar6,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
        }
        ppPVar4 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                            ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                             (in_RDI + 8),*(size_type *)(in_RDI + 0x30));
        *(value_type *)(in_RDI + 0x28) = *ppPVar4;
        lVar5 = PLYElement::getInstances(*(PLYElement **)(in_RDI + 0x28));
        *(long *)(in_RDI + 0x38) = lVar5;
      }
      iVar2 = PLYElement::getPropertyCount((PLYElement *)0x124e46);
      *(int *)(in_RDI + 0x40) = iVar2;
      if (*(int *)in_RDI == 0) {
        std::ostream::operator<<(in_RDI + 0x48,std::endl<char,std::char_traits<char>>);
      }
    }
    *(int *)(in_RDI + 0x44) = 0;
  }
  this_01 = *(PLYElement **)(in_RDI + 0x28);
  PLYElement::getPropertyCount((PLYElement *)0x124e8f);
  this_00 = PLYElement::getProperty(this_01,in_stack_ffffffffffffff7c);
  pPVar7 = anon_unknown_3::PLYProperty::getValue(this_00);
  return pPVar7;
}

Assistant:

PLYValue &PLYWriter::nextValue()
{
  // increment internal pointers to the next (list) value, instance or
  // element, according to the specified header

  plist--;

  if (plist < 0)
  {
    pprop--;

    if (pprop <= 0)
    {
      pinst--;

      if (pinst <= 0)
      {
        element=0;

        pelem++;

        while (pelem < list.size() && (list[pelem]->getInstances() <= 0 ||
                                       list[pelem]->getPropertyCount() == 0))
        {
          pelem++;
        }

        if (pelem >= list.size())
        {
          out.flush();
          throw gutil::IOException("Attempt to write more data than specified in the PLY header");
        }

        element=list[pelem];
        pinst=element->getInstances();
      }

      pprop=element->getPropertyCount();

      if (enc == ply_ascii)
      {
        out << std::endl;
      }
    }

    plist=0;
  }

  return element->getProperty(element->getPropertyCount()-pprop).getValue();
}